

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_nameMatchesAscii(ENCODING *UNUSED_enc,char *ptr1,char *end1,char *ptr2)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  
  cVar3 = *ptr2;
  if (cVar3 != '\0') {
    pcVar1 = ptr2 + 1;
    lVar2 = (long)end1 - (long)ptr1;
    do {
      if (lVar2 < 2) {
        return 0;
      }
      if (*ptr1 != '\0') {
        return 0;
      }
      if (ptr1[1] != cVar3) {
        return 0;
      }
      ptr1 = ptr1 + 2;
      cVar3 = *pcVar1;
      pcVar1 = pcVar1 + 1;
      lVar2 = lVar2 + -2;
    } while (cVar3 != '\0');
  }
  return (uint)(ptr1 == end1);
}

Assistant:

static int PTRCALL
PREFIX(nameMatchesAscii)(const ENCODING *UNUSED_P(enc), const char *ptr1,
                         const char *end1, const char *ptr2)
{
  for (; *ptr2; ptr1 += MINBPC(enc), ptr2++) {
    if (end1 - ptr1 < MINBPC(enc))
      return 0;
    if (!CHAR_MATCHES(enc, ptr1, *ptr2))
      return 0;
  }
  return ptr1 == end1;
}